

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_listener nng_pipe_listener(nng_pipe p)

{
  nng_err nVar1;
  nni_pipe *local_18;
  nni_pipe *pipe;
  nng_pipe p_local;
  nng_listener l;
  
  pipe._0_4_ = p.id;
  memset((void *)((long)&pipe + 4),0,4);
  nVar1 = nni_pipe_find(&local_18,pipe._0_4_);
  if (nVar1 == NNG_OK) {
    pipe._4_4_ = nni_pipe_listener_id(local_18);
    nni_pipe_rele(local_18);
  }
  return (nng_listener)pipe._4_4_;
}

Assistant:

nng_listener
nng_pipe_listener(nng_pipe p)
{
	nng_listener l = NNG_LISTENER_INITIALIZER;
	nni_pipe    *pipe;
	if (nni_pipe_find(&pipe, p.id) == 0) {
		l.id = nni_pipe_listener_id(pipe);
		nni_pipe_rele(pipe);
	}
	return (l);
}